

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O2

BaseStatistics *
duckdb::StringStats::CreateEmpty(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  long lVar1;
  LogicalType LStack_28;
  
  LogicalType::LogicalType(&LStack_28,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  __return_storage_ptr__->has_null = false;
  __return_storage_ptr__->has_no_null = true;
  for (lVar1 = -8; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(undefined1 *)((long)&__return_storage_ptr__->stats_union + lVar1 + 8) = 0xff;
    *(undefined1 *)((long)&__return_storage_ptr__->stats_union + lVar1 + 0x10) = 0;
  }
  (__return_storage_ptr__->stats_union).string_data.max_string_length = 0;
  *(undefined2 *)((long)&__return_storage_ptr__->stats_union + 0x10) = 0x100;
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics StringStats::CreateEmpty(LogicalType type) {
	BaseStatistics result(std::move(type));
	result.InitializeEmpty();
	auto &string_data = StringStats::GetDataUnsafe(result);
	for (idx_t i = 0; i < StringStatsData::MAX_STRING_MINMAX_SIZE; i++) {
		string_data.min[i] = 0xFF;
		string_data.max[i] = 0;
	}
	string_data.max_string_length = 0;
	string_data.has_max_string_length = true;
	string_data.has_unicode = false;
	return result;
}